

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

void process(void)

{
  char cVar1;
  char cVar2;
  ushort uVar3;
  uint uVar4;
  pointer paVar5;
  pointer pPVar6;
  pointer pAVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  ComparisonResult CVar10;
  Palette *pal;
  undefined8 uVar11;
  const_iterator pvVar12;
  const_iterator pvVar13;
  undefined4 extraout_var;
  _Alloc_hider _Var14;
  undefined4 extraout_var_00;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>,_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  pbVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int *piVar16;
  undefined1 uVar17;
  char cVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  optional<File> *file;
  optional<File> *file_00;
  optional<File> *file_01;
  byte bVar23;
  short sVar24;
  ProtoPalette *protoPal;
  png_byte *ppVar25;
  uint32_t x;
  int iVar26;
  unsigned_long uVar27;
  long *plVar28;
  unsigned_short uVar29;
  uint uVar30;
  char *pcVar31;
  long lVar32;
  ProtoPalette *pPVar33;
  byte bVar34;
  byte bVar35;
  uint32_t y;
  uint uVar36;
  int iVar37;
  uint32_t y_00;
  png_colorp ppVar38;
  Palette *pPVar39;
  array<unsigned_short,_4UL> aVar40;
  long *plVar41;
  _Type auVar42;
  bool bVar43;
  bool bVar44;
  ProtoPalette tileColors;
  Rgba color;
  optional<File> palmapOutput;
  Png png;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> vStack_28518;
  _Type auStack_28500;
  uint uStack_284f8;
  uint uStack_284f4;
  uint uStack_284f0;
  uint uStack_284ec;
  vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
  vStack_284e8;
  Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
  VStack_284c8;
  long lStack_284c0;
  ulong uStack_284b8;
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
  tStack_284b0;
  undefined1 auStack_28480 [8];
  vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  avStack_28478 [9];
  __index_type _Stack_28390;
  char cStack_28388;
  undefined1 auStack_28380 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_28370 [2];
  undefined1 auStack_28350 [200];
  char cStack_28288;
  _Variadic_union<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  _Stack_28280;
  char cStack_28188;
  Png PStack_28180;
  
  uVar21 = 0;
  uVar11 = png_get_libpng_ver(0);
  Options::verbosePrint(&options,'\x01',"Using libpng %s\n",uVar11);
  Options::verbosePrint(&options,'\x02',"Reading tiles...\n");
  Png::Png(&PStack_28180,(path *)&options.input);
  if (2 < options.verbosity) {
    process();
  }
  vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
  super__Vector_impl_data._M_start = (ProtoPalette *)0x0;
  vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
  super__Vector_impl_data._M_finish = (ProtoPalette *)0x0;
  vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (ProtoPalette *)0x0;
  vStack_284e8.
  super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (AttrmapEntry *)0x0;
  vStack_284e8.
  super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_284e8.
  super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uStack_284f0 = PStack_28180.width;
  if (options.inputSlice.width != 0) {
    uStack_284f0 = (uint)options.inputSlice.width << 3;
  }
  lStack_284c0 = CONCAT71(lStack_284c0._1_7_,options.columnMajor);
  uVar19 = PStack_28180.height;
  if (options.inputSlice.height != 0) {
    uVar19 = (uint)options.inputSlice.height << 3;
  }
  uStack_284f8 = uVar19;
  if (options.columnMajor != false) {
    uVar21 = (ulong)uStack_284f0;
    uStack_284f8 = 0;
    uStack_284f0 = uVar19;
  }
  if ((int)uVar21 != 0 || uStack_284f8 != 0) {
    uVar19 = 0;
    uVar22 = 0;
    uStack_284b8 = uVar21;
    do {
      uVar8 = options.inputSlice.top;
      uVar9 = options.inputSlice.left;
      auStack_28480._0_2_ = 0xffff;
      auStack_28480._2_2_ = 0xffff;
      auStack_28480._4_2_ = 0xffff;
      auStack_28480._6_2_ = 0xffff;
      if (vStack_284e8.
          super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          vStack_284e8.
          super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>::
        _M_realloc_insert<>(&vStack_284e8,
                            (iterator)
                            vStack_284e8.
                            super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        vStack_284e8.
        super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             vStack_284e8.
             super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar36 = uVar8 + uVar22;
      bVar23 = 0;
      auStack_28500 =
           (_Type)vStack_284e8.
                  super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      iVar37 = 0;
      uStack_284f4 = uVar36;
      uStack_284ec = uVar22;
      do {
        iVar26 = 0;
        do {
          auStack_28380._0_4_ =
               PStack_28180.pixels.
               super__Vector_base<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>.
               _M_impl.super__Vector_impl_data._M_start
               [PStack_28180.width * uVar36 + uVar9 + uVar19 + iVar26];
          uVar11 = auStack_28380._0_8_;
          auStack_28380[3] =
               PStack_28180.pixels.
               super__Vector_base<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>.
               _M_impl.super__Vector_impl_data._M_start
               [PStack_28180.width * uVar36 + uVar9 + uVar19 + iVar26].alpha;
          bVar43 = 0xf < (byte)auStack_28380[3];
          auStack_28380._0_8_ = uVar11;
          if (bVar43) {
            uVar8 = Rgba::cgbColor((Rgba *)auStack_28380);
            bVar43 = ProtoPalette::add((ProtoPalette *)auStack_28480,uVar8);
            bVar23 = bVar23 + bVar43;
          }
          iVar26 = iVar26 + 1;
        } while (iVar26 != 8);
        iVar37 = iVar37 + 1;
        uVar36 = uVar36 + 1;
      } while (iVar37 != 8);
      bVar43 = ProtoPalette::empty((ProtoPalette *)auStack_28480);
      if (bVar43) {
        *(png_colorp *)((long)auStack_28500 + -0x10) = (png_colorp)0xffffffffffffffff;
      }
      else {
        bVar43 = vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                 _M_impl.super__Vector_impl_data._M_finish !=
                 vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (bVar43) {
          lVar32 = 0;
          ppVar38 = (png_colorp)0x0;
          do {
            CVar10 = ProtoPalette::compare
                               ((ProtoPalette *)auStack_28480,
                                (ProtoPalette *)
                                ((long)((vStack_28518.
                                         super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_colorIndices).
                                       _M_elems + lVar32));
            if (CVar10 == THEY_BIGGER) {
LAB_0010e76e:
              *(png_colorp *)((long)auStack_28500 + -0x10) = ppVar38;
              if (bVar43) goto LAB_0010e7e6;
              break;
            }
            if (CVar10 == WE_BIGGER) {
              *(undefined1 (*) [8])
               vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
               super__Vector_impl_data._M_start[(long)ppVar38]._colorIndices._M_elems =
                   auStack_28480;
              goto LAB_0010e76e;
            }
            ppVar38 = (png_colorp)&ppVar38->green;
            lVar32 = lVar32 + 8;
            bVar43 = ppVar38 < (undefined1 *)
                               ((long)vStack_28518.
                                      super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vStack_28518.
                                      super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
          } while (bVar43);
        }
        if ((byte)(options.nbColorsPerPal - options.hasTransparentPixels) < bVar23) {
          fatal("Tile at (%u, %u) has %zu opaque colors, more than %u!",(ulong)(uVar9 + uVar19),
                (ulong)uStack_284f4,(ulong)bVar23,
                (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels));
        }
        *(png_colorp *)((long)auStack_28500 + -0x10) =
             (png_colorp)
             ((long)vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3);
        if ((long)vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                  _M_impl.super__Vector_impl_data._M_start == -8) {
          fatal("Reached %zu proto-palettes... sorry, this image is too much for me to handle :(",
                0xffffffffffffffff);
        }
        if (vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<ProtoPalette,std::allocator<ProtoPalette>>::
          _M_realloc_insert<ProtoPalette_const&>
                    ((vector<ProtoPalette,std::allocator<ProtoPalette>> *)&vStack_28518,
                     (iterator)
                     vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(ProtoPalette *)auStack_28480);
        }
        else {
          *(undefined1 (*) [8])
           ((vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
             super__Vector_impl_data._M_finish)->_colorIndices)._M_elems = auStack_28480;
          vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
LAB_0010e7e6:
      uVar36 = uStack_284ec;
      if ((char)lStack_284c0 != '\0') {
        uVar36 = uVar19;
      }
      uVar36 = uVar36 + 8;
      uVar20 = uVar19;
      if ((char)lStack_284c0 != '\0') {
        uVar20 = uStack_284ec;
      }
      uVar30 = 0;
      if ((char)lStack_284c0 != '\0') {
        uVar30 = uVar36;
        uVar36 = 0;
      }
      uVar20 = uVar20 + 8;
      uVar22 = uVar20;
      if ((char)lStack_284c0 == '\0') {
        uVar19 = uVar20;
        uVar22 = uStack_284ec;
      }
      if (uVar20 == uStack_284f0) {
        uVar19 = uVar30;
        uVar22 = uVar36;
      }
    } while ((uVar19 != (uint)uStack_284b8) || (uVar22 != uStack_284f8));
  }
  pcVar31 = "s";
  if ((long)vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_start == 8) {
    pcVar31 = "";
  }
  Options::verbosePrint
            (&options,'\x03',"Image contains %zu proto-palette%s\n",
             (long)vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,pcVar31);
  pPVar6 = vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar33 = vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (2 < options.verbosity) {
    for (; pPVar33 != pPVar6; pPVar33 = pPVar33 + 1) {
      fputs("[ ",_stderr);
      pvVar12 = ProtoPalette::begin(pPVar33);
      pvVar13 = ProtoPalette::end(pPVar33);
      for (; pvVar12 != pvVar13; pvVar12 = pvVar12 + 1) {
        fprintf(_stderr,"$%04x, ",(ulong)*pvVar12);
      }
      fputs("]\n",_stderr);
    }
  }
  if (options.palSpecType == EMBEDDED) {
    if (PStack_28180.embeddedPal == (png_color *)0x0) {
      fatal("`-c embedded` was given, but the PNG does not have an embedded palette!");
    }
    if (options.palSpec.
        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        options.palSpec.
        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
      _M_realloc_insert<>(&options.palSpec,
                          (iterator)
                          options.palSpec.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
    }
    else {
      paVar5 = options.palSpec.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      paVar5->_M_elems[0].red = '\0';
      paVar5->_M_elems[0].green = '\0';
      paVar5->_M_elems[0].blue = '\0';
      paVar5->_M_elems[0].alpha = '\0';
      paVar5->_M_elems[1].red = '\0';
      paVar5->_M_elems[1].green = '\0';
      paVar5->_M_elems[1].blue = '\0';
      paVar5->_M_elems[1].alpha = '\0';
      paVar5->_M_elems[2].red = '\0';
      paVar5->_M_elems[2].green = '\0';
      paVar5->_M_elems[2].blue = '\0';
      paVar5->_M_elems[2].alpha = '\0';
      paVar5->_M_elems[3].red = '\0';
      paVar5->_M_elems[3].green = '\0';
      paVar5->_M_elems[3].blue = '\0';
      paVar5->_M_elems[3].alpha = '\0';
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           options.palSpec.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if ((long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("options.palSpec.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                    ,0x209,"generatePalSpec");
    }
    uVar19 = (uint)(byte)(options.nbColorsPerPal - options.hasTransparentPixels);
    if (PStack_28180.nbColors <
        (int)(uint)(byte)(options.nbColorsPerPal - options.hasTransparentPixels)) {
      uVar19 = PStack_28180.nbColors;
    }
    if (0 < (int)uVar19) {
      ppVar25 = &(PStack_28180.embeddedPal)->blue;
      uVar21 = 0;
      do {
        if (PStack_28180.transparencyPal == (png_byte *)0x0) {
          uVar22 = 0xff000000;
        }
        else {
          uVar22 = (uint)PStack_28180.transparencyPal[uVar21] << 0x18;
        }
        uVar3._0_1_ = ((png_color *)(ppVar25 + -2))->red;
        uVar3._1_1_ = ((png_color *)(ppVar25 + -2))->green;
        (options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_start)->_M_elems[uVar21] =
             (Rgba)((uint)uVar3 | (uint)*ppVar25 << 0x10 | uVar22);
        uVar21 = uVar21 + 1;
        ppVar25 = ppVar25 + 3;
      } while (uVar19 != uVar21);
    }
  }
  if (options.palSpecType == NO_SPEC) {
    packing::overloadAndRemove
              ((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                *)auStack_28480,&vStack_28518);
    if ((long)avStack_28478[0].
              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)avStack_28478[0].
              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        (long)vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
              super__Vector_impl_data._M_start) {
      __assert_fail("mappings.size() == protoPalettes.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                    ,0x218,"generatePalettes");
    }
    if (2 < options.verbosity) {
      process();
    }
    std::vector<Palette,_std::allocator<Palette>_>::vector
              ((vector<Palette,_std::allocator<Palette>_> *)auStack_28380,(size_type)auStack_28480,
               (allocator_type *)&_Stack_28280._M_first);
    _Var14._M_p = (pointer)auStack_28380._0_8_;
    if (options.hasTransparentPixels == true) {
      for (; _Var14._M_p != (pointer)auStack_28380._8_8_;
          _Var14._M_p = (pointer)((long)_Var14._M_p + 8)) {
        _Var14._M_p[0] = '\0';
        _Var14._M_p[1] = -0x80;
      }
    }
    if (avStack_28478[0].
        super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        avStack_28478[0].
        super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar21 = 0;
      do {
        pPVar39 = (Palette *)
                  (*(long *)((long)avStack_28478[0].
                                   super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar21 * 8) * 8 +
                  auStack_28380._0_8_);
        pPVar33 = vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar21;
        pvVar12 = ProtoPalette::begin(pPVar33);
        pvVar13 = ProtoPalette::end(pPVar33);
        for (; pvVar12 != pvVar13; pvVar12 = pvVar12 + 1) {
          Palette::addColor(pPVar39,*pvVar12);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (ulong)((long)avStack_28478[0].
                                      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)avStack_28478[0].
                                      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (PStack_28180.embeddedPal == (png_color *)0x0) {
      bVar43 = Png::isSuitableForGrayscale(&PStack_28180);
      if (bVar43) {
        sorting::grayscale((vector<Palette,_std::allocator<Palette>_> *)auStack_28380,
                           &PStack_28180.colors._colors);
      }
      else {
        sorting::rgb((vector<Palette,_std::allocator<Palette>_> *)auStack_28380);
      }
    }
    else {
      sorting::indexed((vector<Palette,_std::allocator<Palette>_> *)auStack_28380,
                       PStack_28180.nbColors,PStack_28180.embeddedPal,PStack_28180.transparencyPal);
    }
    std::
    _Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
    ::
    _Tuple_impl<std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>&,std::vector<Palette,std::allocator<Palette>>&,void>
              ((_Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
                *)&tStack_284b0,
               (vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)(auStack_28480 + 8),(vector<Palette,_std::allocator<Palette>_> *)auStack_28380);
    if ((pointer)auStack_28380._0_8_ != (pointer)0x0) {
      operator_delete((void *)auStack_28380._0_8_,
                      aaStack_28370[0]._M_allocated_capacity - auStack_28380._0_8_);
    }
    if ((Png *)avStack_28478[0].
               super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start != (Png *)0x0) {
      operator_delete(avStack_28478[0].
                      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)avStack_28478[0].
                            super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)avStack_28478[0].
                            super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    makePalsAsSpecified(&tStack_284b0,&vStack_28518);
  }
  outputPalettes((vector<Palette,_std::allocator<Palette>_> *)&tStack_284b0);
  if (options.allowDedup == false) {
    if ((uint)options.maxNbTiles._M_elems[1] + (uint)options.maxNbTiles._M_elems[0] <
        (PStack_28180.width >> 3) * (PStack_28180.height >> 3)) {
      fatal("Image contains %u tiles, exceeding the limit of %u + %u");
    }
    if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating unoptimized tile data...\n");
      auStack_28480._0_2_ = 0;
      auStack_28480._2_2_ = 0;
      auStack_28480._4_2_ = 0;
      auStack_28480._6_2_ = 0;
      _Stack_28390 = '\0';
      iVar37 = File::open((File *)auStack_28480,(char *)&options.output,0x14);
      if (CONCAT44(extraout_var,iVar37) == 0) {
        _Stack_28280._M_first._M_storage =
             (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
             &options.output;
        std::
        visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                  ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                    *)auStack_28380,
                   (Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
                    *)&_Stack_28280._M_first,
                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    *)auStack_28480);
        uVar11 = auStack_28380._0_8_;
        piVar16 = __errno_location();
        pcVar31 = strerror(*piVar16);
        fatal("Failed to open \"%s\": %s",uVar11,pcVar31);
      }
      uVar19 = PStack_28180.width >> 3;
      if (options.inputSlice.width != 0) {
        uVar19 = (uint)options.inputSlice.width;
      }
      uVar22 = PStack_28180.height >> 3;
      if (options.inputSlice.height != 0) {
        uVar22 = (uint)options.inputSlice.height;
      }
      uVar21 = (ulong)(uVar22 & 0xffff) * (ulong)(uVar19 & 0xffff);
      lVar32 = uVar21 - options.trim;
      lStack_284c0 = lVar32;
      if (options.trim <= uVar21 && lVar32 != 0) {
        uVar19 = (uint)options.inputSlice.width * 8;
        if (options.inputSlice.width == 0) {
          uVar19 = PStack_28180.width;
        }
        uStack_284f4 = (uint)options.inputSlice.height * 8;
        if (options.inputSlice.height == 0) {
          uStack_284f4 = PStack_28180.height;
        }
        uStack_284f8 = 0;
        uStack_284b8 = CONCAT71(uStack_284b8._1_7_,options.columnMajor);
        uStack_284f0 = uVar19;
        uVar22 = uVar19;
        if (options.columnMajor == false) {
          uStack_284f0 = 0;
          uVar22 = uStack_284f4;
          uStack_284f8 = uStack_284f4;
          uStack_284f4 = uVar19;
        }
        if (uVar22 != 0) {
          uVar19 = 0;
          uVar22 = 0;
          _Var14._M_p = (pointer)vStack_284e8.
                                 super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
          do {
            aaStack_28370[0]._0_8_ =
                 CONCAT44(options.inputSlice.top + uVar22,options.inputSlice.left + uVar19);
            auStack_28380._8_8_ = &PStack_28180;
            if (*(long *)_Var14._M_p == -1) {
              uVar27 = 0;
            }
            else {
              uVar27 = tStack_284b0.
                       super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                       ._M_head_impl.
                       super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[*(long *)_Var14._M_p];
            }
            pPVar39 = tStack_284b0.
                      super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                      .super__Tuple_impl<1UL,_std::vector<Palette,_std::allocator<Palette>_>_>.
                      super__Head_base<1UL,_std::vector<Palette,_std::allocator<Palette>_>,_false>.
                      _M_head_impl.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar27;
            y_00 = 0;
            auStack_28500 = (_Type)_Var14._M_p;
            uStack_284ec = uVar22;
            auStack_28380._0_8_ = _Var14._M_p;
            do {
              uVar9 = TileData::rowBitplanes((Tile *)(auStack_28380 + 8),pPVar39,y_00);
              pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                        *)&_Stack_28280._M_first,
                                       (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                        *)auStack_28480);
              if (*(undefined1 **)(pbVar15 + 0x28) < *(undefined1 **)(pbVar15 + 0x30)) {
                **(undefined1 **)(pbVar15 + 0x28) = (char)uVar9;
                *(long *)(pbVar15 + 0x28) = *(long *)(pbVar15 + 0x28) + 1;
              }
              else {
                (**(code **)(*(long *)pbVar15 + 0x68))(pbVar15,(char)uVar9);
              }
              if (options.bitDepth == '\x02') {
                pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                          *)&_Stack_28280._M_first,
                                         (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                          *)auStack_28480);
                if (*(undefined1 **)(pbVar15 + 0x28) < *(undefined1 **)(pbVar15 + 0x30)) {
                  **(undefined1 **)(pbVar15 + 0x28) = (char)(uVar9 >> 8);
                  *(long *)(pbVar15 + 0x28) = *(long *)(pbVar15 + 0x28) + 1;
                }
                else {
                  (**(code **)(*(long *)pbVar15 + 0x68))(pbVar15,uVar9 >> 8);
                }
              }
              y_00 = y_00 + 1;
            } while (y_00 != 8);
            lStack_284c0 = lStack_284c0 + -1;
            if (lStack_284c0 == 0) goto LAB_0010f437;
            uVar36 = uStack_284ec;
            if ((char)uStack_284b8 != '\0') {
              uVar36 = uVar19;
            }
            uVar36 = uVar36 + 8;
            uVar20 = uVar19;
            if ((char)uStack_284b8 != '\0') {
              uVar20 = uStack_284ec;
            }
            uVar30 = 0;
            if ((char)uStack_284b8 != '\0') {
              uVar30 = uVar36;
              uVar36 = 0;
            }
            uVar20 = uVar20 + 8;
            uVar22 = uVar20;
            if ((char)uStack_284b8 == '\0') {
              uVar19 = uVar20;
              uVar22 = uStack_284ec;
            }
            if (uVar20 == uStack_284f4) {
              uVar19 = uVar30;
              uVar22 = uVar36;
            }
            _Var14._M_p = (pointer)((long)auStack_28500 + 0x10);
          } while ((uVar19 != uStack_284f0) || (uVar22 != uStack_284f8));
          lVar32 = 1;
        }
        if (lVar32 != 0) {
          __assert_fail("remainingTiles == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                        ,0x326,"outputTileData");
        }
      }
LAB_0010f437:
      File::~File((File *)auStack_28480);
    }
    if (((options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) ||
        (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
         _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
         super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false)) ||
       (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true)) {
      Options::verbosePrint
                (&options,'\x02',"Generating unoptimized tilemap and/or attrmap and/or palmap...\n")
      ;
      cStack_28388 = '\0';
      cStack_28288 = '\0';
      cStack_28188 = '\0';
      unoptimized::outputMaps::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&options.tilemap,
                 (optional<std::filesystem::__cxx11::path> *)auStack_28480,file);
      unoptimized::outputMaps::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&options.attrmap,
                 (optional<std::filesystem::__cxx11::path> *)auStack_28380,file_00);
      unoptimized::outputMaps::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&options.palmap,
                 (optional<std::filesystem::__cxx11::path> *)&_Stack_28280._M_first,file_01);
      pAVar7 = vStack_284e8.
               super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (vStack_284e8.
          super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          vStack_284e8.
          super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar23 = 0;
        bVar34 = 0;
        auVar42 = (_Type)vStack_284e8.
                         super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        do {
          lVar32 = *(long *)auVar42;
          if (options.maxNbTiles._M_elems[bVar23] == (ushort)bVar34) {
            if (bVar23 != 0) {
              __assert_fail("bank == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                            ,0x33d,"outputMaps");
            }
            bVar23 = 1;
            bVar34 = 0;
          }
          if (cStack_28388 == '\x01') {
            pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                      *)&VStack_284c8,
                                     (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                      *)auStack_28480);
            cVar18 = options.baseTileIDs._M_elems[bVar23] + bVar34;
            if (*(char **)(pbVar15 + 0x28) < *(char **)(pbVar15 + 0x30)) {
              **(char **)(pbVar15 + 0x28) = cVar18;
              *(long *)(pbVar15 + 0x28) = *(long *)(pbVar15 + 0x28) + 1;
            }
            else {
              (**(code **)(*(long *)pbVar15 + 0x68))(pbVar15,cVar18);
            }
          }
          if (cStack_28288 == '\x01') {
            if (lVar32 == -1) {
              bVar35 = 0;
            }
            else {
              bVar35 = (byte)tStack_284b0.
                             super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                             ._M_head_impl.
                             super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar32] & 7;
            }
            pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                      *)&VStack_284c8,
                                     (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                      *)auStack_28380);
            bVar35 = bVar35 | bVar23 * '\b';
            if (*(byte **)(pbVar15 + 0x28) < *(byte **)(pbVar15 + 0x30)) {
              **(byte **)(pbVar15 + 0x28) = bVar35;
              *(long *)(pbVar15 + 0x28) = *(long *)(pbVar15 + 0x28) + 1;
            }
            else {
              (**(code **)(*(long *)pbVar15 + 0x68))(pbVar15,bVar35);
            }
          }
          if (cStack_28188 == '\x01') {
            pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                      *)&VStack_284c8,
                                     (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                      *)&_Stack_28280._M_first);
            if (lVar32 == -1) {
              uVar17 = 0;
            }
            else {
              uVar17 = (undefined1)
                       tStack_284b0.
                       super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                       ._M_head_impl.
                       super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar32];
            }
            if (*(undefined1 **)(pbVar15 + 0x28) < *(undefined1 **)(pbVar15 + 0x30)) {
              **(undefined1 **)(pbVar15 + 0x28) = uVar17;
              *(long *)(pbVar15 + 0x28) = *(long *)(pbVar15 + 0x28) + 1;
            }
            else {
              (**(code **)(*(long *)pbVar15 + 0x68))(pbVar15,uVar17);
            }
          }
          bVar34 = bVar34 + 1;
          auVar42 = (_Type)((long)auVar42 + 0x10);
        } while (auVar42 != (_Type)pAVar7);
      }
      if (cStack_28188 == '\x01') {
        cStack_28188 = '\0';
        File::~File((File *)&_Stack_28280._M_first);
      }
      if (cStack_28288 == '\x01') {
        cStack_28288 = '\0';
        File::~File((File *)auStack_28380);
      }
      if (cStack_28388 == '\x01') {
        cStack_28388 = '\0';
        File::~File((File *)auStack_28480);
      }
    }
  }
  else {
    Options::verbosePrint(&options,'\x02',"Deduplicating tiles...\n");
    bVar43 = options.columnMajor;
    auStack_28380._0_8_ = auStack_28350;
    auStack_28380._8_2_ = 1;
    auStack_28380._10_2_ = 0;
    auStack_28380._12_2_ = 0;
    auStack_28380._14_2_ = 0;
    aaStack_28370[0]._M_allocated_capacity = (_Hash_node_base *)0x0;
    aaStack_28370[0]._8_8_ = 0;
    aaStack_28370[1]._0_4_ = 1.0;
    aaStack_28370[1]._8_8_ = 0;
    auStack_28350._0_8_ = (__node_base_ptr)0x0;
    auStack_28350._8_8_ = (long *)0x0;
    auStack_28350._16_8_ = 0;
    auStack_28350._24_8_ = 0;
    if (options.inputSlice.width != 0) {
      PStack_28180.width = (uint)options.inputSlice.width << 3;
    }
    if (options.inputSlice.height != 0) {
      PStack_28180.height = (uint)options.inputSlice.height << 3;
    }
    uVar19 = PStack_28180.width;
    if (options.columnMajor != false) {
      uVar19 = PStack_28180.height;
    }
    auStack_28500[0] = (short)uVar19;
    auStack_28500[1] = (short)(uVar19 >> 0x10);
    if (options.columnMajor != false) {
      PStack_28180.height = 0;
    }
    else {
      PStack_28180.width = 0;
    }
    if (PStack_28180.width != 0 || PStack_28180.height != 0) {
      uVar19 = 0;
      uVar22 = 0;
      aVar40._M_elems =
           (_Type)vStack_284e8.
                  super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      do {
        avStack_28478[0].
        super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(options.inputSlice.top + uVar22,options.inputSlice.left + uVar19);
        avStack_28478[0].
        super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&PStack_28180;
        auStack_28480 = (undefined1  [8])aVar40._M_elems;
        optimized::UniqueTiles::addTile
                  ((UniqueTiles *)&_Stack_28280._M_first,(Tile *)auStack_28380,
                   (Palette *)(auStack_28480 + 8));
        uVar36 = uVar22;
        if (bVar43 != false) {
          uVar36 = uVar19;
        }
        uVar36 = uVar36 + 8;
        uVar20 = uVar19;
        if (bVar43 != false) {
          uVar20 = uVar22;
        }
        uVar30 = 0;
        if (bVar43 != false) {
          uVar30 = uVar36;
          uVar36 = 0;
        }
        uVar20 = uVar20 + 8;
        uVar4 = uVar20;
        if (bVar43 == false) {
          uVar19 = uVar20;
          uVar4 = uVar22;
        }
        *(bool *)((long)aVar40._M_elems + 0xb) = _Stack_28280._0_4_ == 2 || _Stack_28280._0_4_ == 4;
        *(bool *)((long)aVar40._M_elems + 10) = _Stack_28280._0_4_ == 3 || _Stack_28280._0_4_ == 4;
        uVar29 = options.maxNbTiles._M_elems[0];
        bVar44 = options.maxNbTiles._M_elems[0] <= (ushort)_Stack_28280._4_2_;
        *(bool *)((long)aVar40._M_elems + 9) = bVar44;
        if (!bVar44) {
          uVar29 = 0;
        }
        *(uchar *)&(((File *)((long)aVar40._M_elems + 8))->_file).
                   super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                   .
                   super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   .
                   super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   .super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
             = (_Stack_28280._4_1_ - (char)uVar29) + options.baseTileIDs._M_elems[bVar44];
        uVar22 = uVar4;
        if (uVar20 == auStack_28500._0_4_) {
          uVar19 = uVar30;
          uVar22 = uVar36;
        }
        aVar40._M_elems = aVar40._M_elems + 0x10;
      } while ((uVar19 != PStack_28180.width) || (uVar22 != PStack_28180.height));
    }
    if ((ulong)options.maxNbTiles._M_elems[1] + (ulong)options.maxNbTiles._M_elems[0] <
        (ulong)((long)(auStack_28350._16_8_ - auStack_28350._8_8_) >> 3)) {
      fatal("Image contains %zu tiles, exceeding the limit of %u + %u");
    }
    if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized tile data...\n");
      auStack_28480._0_2_ = 0;
      auStack_28480._2_2_ = 0;
      auStack_28480._4_2_ = 0;
      auStack_28480._6_2_ = 0;
      _Stack_28390 = '\0';
      iVar37 = File::open((File *)auStack_28480,(char *)&options.output,0x14);
      if (CONCAT44(extraout_var_00,iVar37) == 0) {
        VStack_284c8.super_anon_class_8_1_89901123.path = (anon_class_8_1_89901123)&options.output;
        std::
        visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                  ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                    *)&_Stack_28280._M_first,&VStack_284c8,
                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    *)auStack_28480);
        piVar16 = __errno_location();
        pcVar31 = strerror(*piVar16);
        fatal("Failed to create \"%s\": %s",_Stack_28280._M_first._M_storage,pcVar31);
      }
      plVar28 = (long *)(auStack_28350._16_8_ + options.trim * -8);
      if ((long *)auStack_28350._8_8_ != plVar28) {
        sVar24 = 0;
        plVar41 = (long *)auStack_28350._8_8_;
        do {
          lVar32 = *plVar41;
          if (sVar24 != *(short *)(lVar32 + 0x12)) {
            __assert_fail("tile->tileID == tileID",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                          ,0x39e,"outputTileData");
          }
          pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                    *)&_Stack_28280._M_first,
                                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                    *)auStack_28480);
          (**(code **)(*(long *)pbVar15 + 0x60))(pbVar15,lVar32,(ulong)options.bitDepth << 3);
          plVar41 = plVar41 + 1;
          sVar24 = sVar24 + 1;
        } while (plVar41 != plVar28);
      }
      File::~File((File *)auStack_28480);
    }
    if (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
        _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized tilemap...\n");
      auStack_28480._0_2_ = 0;
      auStack_28480._2_2_ = 0;
      auStack_28480._4_2_ = 0;
      auStack_28480._6_2_ = 0;
      _Stack_28390 = '\0';
      iVar37 = File::open((File *)auStack_28480,(char *)&options.tilemap,0x14);
      pAVar7 = vStack_284e8.
               super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (CONCAT44(extraout_var_01,iVar37) == 0) {
        VStack_284c8.super_anon_class_8_1_89901123.path = (anon_class_8_1_89901123)&options.tilemap;
        std::
        visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                  ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                    *)&_Stack_28280._M_first,&VStack_284c8,
                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    *)auStack_28480);
        piVar16 = __errno_location();
        pcVar31 = strerror(*piVar16);
        fatal("Failed to create \"%s\": %s",_Stack_28280._M_first._M_storage,pcVar31);
      }
      if (vStack_284e8.
          super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          vStack_284e8.
          super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        auVar42 = (_Type)vStack_284e8.
                         super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        do {
          pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                    *)&_Stack_28280._M_first,
                                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                    *)auStack_28480);
          uVar17 = *(undefined1 *)
                    &(((File *)((long)auVar42 + 8))->_file).
                     super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                     .
                     super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
          ;
          if (*(undefined1 **)(pbVar15 + 0x28) < *(undefined1 **)(pbVar15 + 0x30)) {
            **(undefined1 **)(pbVar15 + 0x28) = uVar17;
            *(long *)(pbVar15 + 0x28) = *(long *)(pbVar15 + 0x28) + 1;
          }
          else {
            (**(code **)(*(long *)pbVar15 + 0x68))(pbVar15,uVar17);
          }
          auVar42 = (_Type)((long)auVar42 + 0x10);
        } while (auVar42 != (_Type)pAVar7);
      }
      File::~File((File *)auStack_28480);
    }
    if (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
        _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized attrmap...\n");
      auStack_28480._0_2_ = 0;
      auStack_28480._2_2_ = 0;
      auStack_28480._4_2_ = 0;
      auStack_28480._6_2_ = 0;
      _Stack_28390 = '\0';
      iVar37 = File::open((File *)auStack_28480,(char *)&options.attrmap,0x14);
      pAVar7 = vStack_284e8.
               super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      auVar42 = (_Type)vStack_284e8.
                       super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      if (CONCAT44(extraout_var_02,iVar37) == 0) {
        VStack_284c8.super_anon_class_8_1_89901123.path = (anon_class_8_1_89901123)&options.attrmap;
        std::
        visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                  ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                    *)&_Stack_28280._M_first,&VStack_284c8,
                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    *)auStack_28480);
        piVar16 = __errno_location();
        pcVar31 = strerror(*piVar16);
        fatal("Failed to create \"%s\": %s",_Stack_28280._M_first._M_storage,pcVar31);
      }
      for (; auVar42 != (_Type)pAVar7; auVar42 = (_Type)((long)auVar42 + 0x10)) {
        if (*(long *)auVar42 == -1) {
          bVar23 = 0;
        }
        else {
          bVar23 = (byte)tStack_284b0.
                         super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                         ._M_head_impl.
                         super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[*(long *)auVar42] & 7;
        }
        cVar18 = *(char *)((long)auVar42 + 0xb);
        cVar1 = *(char *)((long)auVar42 + 10);
        cVar2 = *(char *)((long)auVar42 + 9);
        pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                  *)&_Stack_28280._M_first,
                                 (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                  *)auStack_28480);
        bVar23 = cVar2 << 3 | cVar1 << 6 | cVar18 << 5 | bVar23;
        if (*(byte **)(pbVar15 + 0x28) < *(byte **)(pbVar15 + 0x30)) {
          **(byte **)(pbVar15 + 0x28) = bVar23;
          *(long *)(pbVar15 + 0x28) = *(long *)(pbVar15 + 0x28) + 1;
        }
        else {
          (**(code **)(*(long *)pbVar15 + 0x68))(pbVar15,bVar23);
        }
      }
      File::~File((File *)auStack_28480);
    }
    if (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized palmap...\n");
      auStack_28480._0_2_ = 0;
      auStack_28480._2_2_ = 0;
      auStack_28480._4_2_ = 0;
      auStack_28480._6_2_ = 0;
      _Stack_28390 = '\0';
      iVar37 = File::open((File *)auStack_28480,(char *)&options.palmap,0x14);
      pAVar7 = vStack_284e8.
               super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (CONCAT44(extraout_var_03,iVar37) == 0) {
        VStack_284c8.super_anon_class_8_1_89901123.path = (anon_class_8_1_89901123)&options.palmap;
        std::
        visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                  ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                    *)&_Stack_28280._M_first,&VStack_284c8,
                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    *)auStack_28480);
        piVar16 = __errno_location();
        pcVar31 = strerror(*piVar16);
        fatal("Failed to create \"%s\": %s",_Stack_28280._M_first._M_storage,pcVar31);
      }
      if (vStack_284e8.
          super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          vStack_284e8.
          super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        auVar42 = (_Type)vStack_284e8.
                         super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        do {
          pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                    *)&_Stack_28280._M_first,
                                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                    *)auStack_28480);
          if (*(long *)auVar42 == -1) {
            uVar17 = 0;
          }
          else {
            uVar17 = (undefined1)
                     tStack_284b0.
                     super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[*(long *)auVar42];
          }
          if (*(undefined1 **)(pbVar15 + 0x28) < *(undefined1 **)(pbVar15 + 0x30)) {
            **(undefined1 **)(pbVar15 + 0x28) = uVar17;
            *(long *)(pbVar15 + 0x28) = *(long *)(pbVar15 + 0x28) + 1;
          }
          else {
            (**(code **)(*(long *)pbVar15 + 0x68))(pbVar15,uVar17);
          }
          auVar42 = (_Type)((long)auVar42 + 0x10);
        } while (auVar42 != (_Type)pAVar7);
      }
      File::~File((File *)auStack_28480);
    }
    if ((long *)auStack_28350._8_8_ != (long *)0x0) {
      operator_delete((void *)auStack_28350._8_8_,auStack_28350._24_8_ - auStack_28350._8_8_);
    }
    std::
    _Hashtable<TileData,_TileData,_std::allocator<TileData>,_std::__detail::_Identity,_std::equal_to<TileData>,_std::hash<TileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<TileData,_TileData,_std::allocator<TileData>,_std::__detail::_Identity,_std::equal_to<TileData>,_std::hash<TileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_28380);
  }
  if (tStack_284b0.
      super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
      .
      super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
      ._M_head_impl.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tStack_284b0.
                    super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                    .
                    super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tStack_284b0.
                          super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                          .
                          super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tStack_284b0.
                          super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                          .
                          super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (tStack_284b0.
      super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
      .super__Tuple_impl<1UL,_std::vector<Palette,_std::allocator<Palette>_>_>.
      super__Head_base<1UL,_std::vector<Palette,_std::allocator<Palette>_>,_false>._M_head_impl.
      super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(tStack_284b0.
                    super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                    .super__Tuple_impl<1UL,_std::vector<Palette,_std::allocator<Palette>_>_>.
                    super__Head_base<1UL,_std::vector<Palette,_std::allocator<Palette>_>,_false>.
                    _M_head_impl.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)tStack_284b0.
                          super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                          .super__Tuple_impl<1UL,_std::vector<Palette,_std::allocator<Palette>_>_>.
                          super__Head_base<1UL,_std::vector<Palette,_std::allocator<Palette>_>,_false>
                          ._M_head_impl.super__Vector_base<Palette,_std::allocator<Palette>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tStack_284b0.
                          super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                          .super__Tuple_impl<1UL,_std::vector<Palette,_std::allocator<Palette>_>_>.
                          super__Head_base<1UL,_std::vector<Palette,_std::allocator<Palette>_>,_false>
                          ._M_head_impl.super__Vector_base<Palette,_std::allocator<Palette>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Type)vStack_284e8.
             super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_start != (_Type)0x0) {
    operator_delete(vStack_284e8.
                    super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_284e8.
                          super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_284e8.
                          super__Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
      super__Vector_impl_data._M_start != (ProtoPalette *)0x0) {
    operator_delete(vStack_28518.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_28518.
                          super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_28518.
                          super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Png::~Png(&PStack_28180);
  return;
}

Assistant:

void process() {
	options.verbosePrint(Options::VERB_CFG, "Using libpng %s\n", png_get_libpng_ver(nullptr));

	options.verbosePrint(Options::VERB_LOG_ACT, "Reading tiles...\n");
	Png png(*options.input); // This also sets `hasTransparentPixels` as a side effect
	ImagePalette const &colors = png.getColors();

	// Now, we have all the image's colors in `colors`
	// The next step is to order the palette

	if (options.verbosity >= Options::VERB_INTERM) {
		fputs("Image colors: [ ", stderr);
		for (auto const &slot : colors) {
			if (!slot.has_value()) {
				continue;
			}
			fprintf(stderr, "#%08x, ", slot->toCSS());
		}
		fputs("]\n", stderr);
	}

	// Now, iterate through the tiles, generating proto-palettes as we go
	// We do this unconditionally because this performs the image validation (which we want to
	// perform even if no output is requested), and because it's necessary to generate any
	// output (with the exception of an un-duplicated tilemap, but that's an acceptable loss.)
	std::vector<ProtoPalette> protoPalettes;
	DefaultInitVec<AttrmapEntry> attrmap{};

	for (auto tile : png.visitAsTiles()) {
		ProtoPalette tileColors;
		AttrmapEntry &attrs = attrmap.emplace_back();
		uint8_t nbColorsInTile = 0;

		for (uint32_t y = 0; y < 8; ++y) {
			for (uint32_t x = 0; x < 8; ++x) {
				Rgba color = tile.pixel(x, y);
				if (!color.isTransparent()) { // Do not count transparency in for packing
					// Add the color to the proto-pal (if not full), and count it if it was unique.
					if (tileColors.add(color.cgbColor())) {
						++nbColorsInTile;
					}
				}
			}
		}

		if (tileColors.empty()) {
			// "Empty" proto-palettes screw with the packing process, so discard those
			attrs.protoPaletteID = AttrmapEntry::transparent;
			continue;
		}

		// Insert the proto-palette, making sure to avoid overlaps
		for (size_t n = 0; n < protoPalettes.size(); ++n) {
			switch (tileColors.compare(protoPalettes[n])) {
			case ProtoPalette::WE_BIGGER:
				protoPalettes[n] = tileColors; // Override them
				// Remove any other proto-palettes that we encompass
				// (Example [(0, 1), (0, 2)], inserting (0, 1, 2))
				/*
				 * The following code does its job, except that references to the removed
				 * proto-palettes are not updated, causing issues.
				 * TODO: overlap might not be detrimental to the packing algorithm.
				 * Investigation is necessary, especially if pathological cases are found.
				 *
				 * for (size_t i = protoPalettes.size(); --i != n;) {
				 *     if (tileColors.compare(protoPalettes[i]) == ProtoPalette::WE_BIGGER) {
				 *         protoPalettes.erase(protoPalettes.begin() + i);
				 *     }
				 * }
				 */
				[[fallthrough]];

			case ProtoPalette::THEY_BIGGER:
				// Do nothing, they already contain us
				attrs.protoPaletteID = n;
				goto contained;

			case ProtoPalette::NEITHER:
				break; // Keep going
			}
		}

		if (nbColorsInTile > options.maxOpaqueColors()) {
			fatal("Tile at (%" PRIu32 ", %" PRIu32 ") has %zu opaque colors, more than %" PRIu8 "!",
			      tile.x, tile.y, nbColorsInTile, options.maxOpaqueColors());
		}

		attrs.protoPaletteID = protoPalettes.size();
		if (protoPalettes.size() == AttrmapEntry::transparent) { // Check for overflow
			fatal("Reached %zu proto-palettes... sorry, this image is too much for me to handle :(",
			      AttrmapEntry::transparent);
		}
		protoPalettes.push_back(tileColors);
contained:;
	}

	options.verbosePrint(Options::VERB_INTERM, "Image contains %zu proto-palette%s\n",
	                     protoPalettes.size(), protoPalettes.size() != 1 ? "s" : "");
	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto const &protoPal : protoPalettes) {
			fputs("[ ", stderr);
			for (uint16_t color : protoPal) {
				fprintf(stderr, "$%04x, ", color);
			}
			fputs("]\n", stderr);
		}
	}

	if (options.palSpecType == Options::EMBEDDED) {
		generatePalSpec(png);
	}
	auto [mappings, palettes] = options.palSpecType == Options::NO_SPEC
	                                ? generatePalettes(protoPalettes, png)
	                                : makePalsAsSpecified(protoPalettes);
	outputPalettes(palettes);

	// If deduplication is not happening, we just need to output the tile data and/or maps as-is
	if (!options.allowDedup) {
		uint32_t const nbTilesH = png.getHeight() / 8, nbTilesW = png.getWidth() / 8;

		// Check the tile count
		if (nbTilesW * nbTilesH > options.maxNbTiles[0] + options.maxNbTiles[1]) {
			fatal("Image contains %" PRIu32 " tiles, exceeding the limit of %" PRIu16 " + %" PRIu16,
			      nbTilesW * nbTilesH, options.maxNbTiles[0], options.maxNbTiles[1]);
		}

		if (options.output.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating unoptimized tile data...\n");
			unoptimized::outputTileData(png, attrmap, palettes, mappings);
		}

		if (options.tilemap.has_value() || options.attrmap.has_value()
		    || options.palmap.has_value()) {
			options.verbosePrint(
			    Options::VERB_LOG_ACT,
			    "Generating unoptimized tilemap and/or attrmap and/or palmap...\n");
			unoptimized::outputMaps(attrmap, mappings);
		}
	} else {
		// All of these require the deduplication process to be performed to be output
		options.verbosePrint(Options::VERB_LOG_ACT, "Deduplicating tiles...\n");
		optimized::UniqueTiles tiles = optimized::dedupTiles(png, attrmap, palettes, mappings);

		if (tiles.size() > options.maxNbTiles[0] + options.maxNbTiles[1]) {
			fatal("Image contains %zu tiles, exceeding the limit of %" PRIu16 " + %" PRIu16,
			      tiles.size(), options.maxNbTiles[0], options.maxNbTiles[1]);
		}

		if (options.output.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized tile data...\n");
			optimized::outputTileData(tiles);
		}

		if (options.tilemap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized tilemap...\n");
			optimized::outputTilemap(attrmap);
		}

		if (options.attrmap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized attrmap...\n");
			optimized::outputAttrmap(attrmap, mappings);
		}

		if (options.palmap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized palmap...\n");
			optimized::outputPalmap(attrmap, mappings);
		}
	}
}